

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopFusion::CheckCondition(LoopFusion *this)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  bool bVar5;
  uint32_t uVar6;
  Instruction *this_00;
  Instruction *this_01;
  Instruction *pIVar7;
  Instruction *pIVar8;
  uint uVar9;
  uint uVar10;
  
  this_00 = Loop::GetConditionInst(this->loop_0_);
  this_01 = Loop::GetConditionInst(this->loop_1_);
  bVar5 = Loop::IsSupportedCondition(this->loop_0_,this_00->opcode_);
  if (((!bVar5) || (bVar5 = Loop::IsSupportedCondition(this->loop_1_,this_01->opcode_), !bVar5)) ||
     (this_00->opcode_ != this_01->opcode_)) {
    return false;
  }
  uVar6 = Instruction::NumInOperandWords(this_00);
  if (uVar6 != 0) {
    uVar9 = 0;
    do {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pDVar2 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      uVar10 = (this_00->has_result_id_ & 1) + 1;
      if (this_00->has_type_id_ == false) {
        uVar10 = (uint)this_00->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(this_00,uVar10 + uVar9);
      pIVar7 = analysis::DefUseManager::GetDef(pDVar2,uVar6);
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      pDVar2 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      uVar10 = (this_01->has_result_id_ & 1) + 1;
      if (this_01->has_type_id_ == false) {
        uVar10 = (uint)this_01->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(this_01,uVar10 + uVar9);
      pIVar8 = analysis::DefUseManager::GetDef(pDVar2,uVar6);
      pIVar3 = this->induction_0_;
      pIVar4 = this->induction_1_;
      if ((pIVar7 != pIVar3) || (pIVar8 != pIVar4)) {
        if (pIVar7 != pIVar8) {
          return false;
        }
        if (pIVar7 == pIVar3 && pIVar8 != pIVar4) {
          return false;
        }
        if (pIVar7 != pIVar3 && pIVar8 == pIVar4) {
          return false;
        }
      }
      uVar9 = uVar9 + 1;
      uVar6 = Instruction::NumInOperandWords(this_00);
    } while (uVar9 < uVar6);
  }
  return true;
}

Assistant:

bool LoopFusion::CheckCondition() {
  auto condition_0 = loop_0_->GetConditionInst();
  auto condition_1 = loop_1_->GetConditionInst();

  if (!loop_0_->IsSupportedCondition(condition_0->opcode()) ||
      !loop_1_->IsSupportedCondition(condition_1->opcode())) {
    return false;
  }

  if (condition_0->opcode() != condition_1->opcode()) {
    return false;
  }

  for (uint32_t i = 0; i < condition_0->NumInOperandWords(); ++i) {
    auto arg_0 = context_->get_def_use_mgr()->GetDef(
        condition_0->GetSingleWordInOperand(i));
    auto arg_1 = context_->get_def_use_mgr()->GetDef(
        condition_1->GetSingleWordInOperand(i));

    if (arg_0 == induction_0_ && arg_1 == induction_1_) {
      continue;
    }

    if (arg_0 == induction_0_ && arg_1 != induction_1_) {
      return false;
    }

    if (arg_1 == induction_1_ && arg_0 != induction_0_) {
      return false;
    }

    if (arg_0 != arg_1) {
      return false;
    }
  }

  return true;
}